

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::dumpValue(Dumper *this,Slice slice,Slice *base)

{
  CustomTypeHandler *pCVar1;
  byte bVar2;
  ExceptionType type;
  byte bVar3;
  bool bVar4;
  char *pcVar5;
  Slice SVar6;
  int64_t v;
  uint8_t *puVar7;
  _func_int **pp_Var8;
  Exception *this_00;
  uint uVar9;
  uint64_t v_00;
  Sink *pSVar10;
  ValueLength i;
  ulong uVar11;
  double v_01;
  ObjectPair OVar12;
  undefined8 uStack_70;
  Slice slice_local;
  ValueLength len;
  ValueLength local_48;
  ValueLength local_40;
  double local_38;
  
  bVar3 = *slice._start;
  slice_local._start = slice._start;
  if (((bVar3 & 0xfe) == 0xee & this->options->debugTags) == 1) {
    if (bVar3 == 0xee) {
      v_00 = (uint64_t)slice._start[1];
    }
    else {
      v_00 = *(uint64_t *)(slice._start + 1);
    }
    appendUInt(this,v_00);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
    bVar3 = *slice._start;
  }
  switch(SliceStaticData::TypeMap[bVar3]) {
  case None:
  case Illegal:
  case MinKey:
  case MaxKey:
    goto switchD_0010e6bd_caseD_0;
  case Null:
    (*this->_sink->_vptr_Sink[3])(this->_sink,"null",4);
    return;
  case Bool:
    bVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBool
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &slice_local);
    if (bVar4) {
      pcVar5 = "true";
      uStack_70 = 4;
    }
    else {
      pcVar5 = "false";
      uStack_70 = 5;
    }
    (*this->_sink->_vptr_Sink[3])(this->_sink,pcVar5,uStack_70);
    break;
  case Array:
    ArrayIterator::ArrayIterator((ArrayIterator *)&len,slice);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x5b);
    if (this->options->prettyPrint == true) {
      (*this->_sink->_vptr_Sink[2])(this->_sink,10);
      this->_indentation = this->_indentation + 1;
      while (local_40 != local_48) {
        indent(this);
        SVar6 = ArrayIterator::value((ArrayIterator *)&len);
        dumpValue(this,SVar6,&slice_local);
        if (local_40 + 1 != local_48) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
        }
        (*this->_sink->_vptr_Sink[2])(this->_sink,10);
        ArrayIterator::next((ArrayIterator *)&len);
      }
      this->_indentation = this->_indentation + -1;
      indent(this);
    }
    else if (this->options->singleLinePrettyPrint == false) {
      while (local_40 != local_48) {
        if (local_40 != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
        }
        SVar6 = ArrayIterator::value((ArrayIterator *)&len);
        dumpValue(this,SVar6,&slice_local);
        ArrayIterator::next((ArrayIterator *)&len);
      }
    }
    else {
      while (local_40 != local_48) {
        if (local_40 != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        }
        SVar6 = ArrayIterator::value((ArrayIterator *)&len);
        dumpValue(this,SVar6,&slice_local);
        ArrayIterator::next((ArrayIterator *)&len);
      }
    }
    pSVar10 = this->_sink;
    pp_Var8 = pSVar10->_vptr_Sink;
    uStack_70 = 0x5d;
    goto LAB_0010ebff;
  case Object:
    ObjectIterator::ObjectIterator
              ((ObjectIterator *)&len,slice,(bool)(this->options->dumpAttributesInIndexOrder ^ 1));
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x7b);
    if (this->options->prettyPrint == true) {
      (*this->_sink->_vptr_Sink[2])(this->_sink,10);
      this->_indentation = this->_indentation + 1;
      while (local_40 != local_48) {
        OVar12 = ObjectIterator::operator*((ObjectIterator *)&len);
        indent(this);
        dumpValue(this,OVar12.key._start,&slice_local);
        (*this->_sink->_vptr_Sink[3])(this->_sink," : ",3);
        dumpValue(this,OVar12.value._start,&slice_local);
        if (local_40 + 1 != local_48) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
        }
        (*this->_sink->_vptr_Sink[2])(this->_sink,10);
        ObjectIterator::next((ObjectIterator *)&len);
      }
      this->_indentation = this->_indentation + -1;
      indent(this);
    }
    else if (this->options->singleLinePrettyPrint == false) {
      while (local_40 != local_48) {
        if (local_40 != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
        }
        OVar12 = ObjectIterator::operator*((ObjectIterator *)&len);
        dumpValue(this,OVar12.key._start,&slice_local);
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
        dumpValue(this,OVar12.value._start,&slice_local);
        ObjectIterator::next((ObjectIterator *)&len);
      }
    }
    else {
      while (local_40 != local_48) {
        if (local_40 != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        }
        OVar12 = ObjectIterator::operator*((ObjectIterator *)&len);
        dumpValue(this,OVar12.key._start,&slice_local);
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        dumpValue(this,OVar12.value._start,&slice_local);
        ObjectIterator::next((ObjectIterator *)&len);
      }
    }
    pSVar10 = this->_sink;
    pp_Var8 = pSVar10->_vptr_Sink;
    uStack_70 = 0x7d;
    goto LAB_0010ebff;
  case Double:
    v_01 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getDouble
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      &slice_local);
    if (NAN(v_01)) {
      if (this->options->unsupportedDoublesAsString == false) goto LAB_0010ed32;
      pSVar10 = this->_sink;
      pp_Var8 = pSVar10->_vptr_Sink;
      pcVar5 = "\"NaN\"";
      uStack_70 = 5;
    }
    else {
      if (ABS(v_01) != INFINITY) {
        appendDouble(this,v_01);
        return;
      }
      if (this->options->unsupportedDoublesAsString == false) {
LAB_0010ed32:
        handleUnsupportedType(this,slice_local);
        return;
      }
      local_38 = v_01;
      (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
      if (local_38 <= -INFINITY) {
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x2d);
      }
      pSVar10 = this->_sink;
      pp_Var8 = pSVar10->_vptr_Sink;
      pcVar5 = "Infinity\"";
      uStack_70 = 9;
    }
    (*pp_Var8[3])(pSVar10,pcVar5,uStack_70);
    break;
  case UTCDate:
    if (this->options->datesAsIntegers == true) {
      v = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUTCDate
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &slice_local);
      appendInt(this,v);
      return;
    }
    goto switchD_0010e6bd_caseD_0;
  case External:
    if (base == (Slice *)0x0) {
      base = &slice_local;
    }
    SVar6._start = (uint8_t *)
                   SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getExternal
                             ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *
                              )&slice_local);
    dumpValue(this,SVar6,base);
    break;
  case Int:
  case UInt:
  case SmallInt:
    dumpInteger(this,slice);
    return;
  case String:
    pcVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        &slice_local,&len);
    (*this->_sink->_vptr_Sink[4])(this->_sink,len + 2);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
    dumpString(this,pcVar5,len);
    pSVar10 = this->_sink;
    pp_Var8 = pSVar10->_vptr_Sink;
    uStack_70 = 0x22;
    goto LAB_0010ebff;
  case Binary:
    if (this->options->binaryAsHex != true) goto switchD_0010e6bd_caseD_0;
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
    puVar7 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBinary
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        &slice_local,&len);
    for (uVar11 = 0; uVar11 < len; uVar11 = uVar11 + 1) {
      bVar3 = puVar7[uVar11];
      uVar9 = (uint)(byte)((bVar3 >> 4) + 0x57);
      if (bVar3 < 0xa0) {
        uVar9 = (bVar3 >> 4) + 0x30;
      }
      (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)uVar9);
      bVar3 = bVar3 & 0xf;
      bVar2 = bVar3 + 0x57;
      if (bVar3 < 10) {
        bVar2 = bVar3 + 0x30;
      }
      (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)bVar2);
    }
    pSVar10 = this->_sink;
    pp_Var8 = pSVar10->_vptr_Sink;
    uStack_70 = 0x22;
LAB_0010ebff:
    (*pp_Var8[2])(pSVar10,uStack_70);
    break;
  case BCD:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = NotImplemented;
LAB_0010ecf5:
    Exception::Exception(this_00,type);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case Custom:
    pCVar1 = this->options->customTypeHandler;
    if (pCVar1 == (CustomTypeHandler *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      type = NeedCustomTypeHandler;
      goto LAB_0010ecf5;
    }
    if (base == (Slice *)0x0) {
      base = &slice_local;
    }
    (*pCVar1->_vptr_CustomTypeHandler[2])(pCVar1,&slice_local,this,base);
    break;
  case Tagged:
    SVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::value
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &slice_local);
    dump(this,SVar6);
  }
  return;
switchD_0010e6bd_caseD_0:
  handleUnsupportedType(this,slice);
  return;
}

Assistant:

void Dumper::dumpValue(Slice slice, Slice const* base) {
  if (options->debugTags && slice.isTagged()) {
    appendUInt(slice.getFirstTag());
    _sink->push_back(':');
  }

  switch (slice.type()) {
    case ValueType::Null: {
      _sink->append("null", 4);
      break;
    }

    case ValueType::Bool: {
      if (slice.getBool()) {
        _sink->append("true", 4);
      } else {
        _sink->append("false", 5);
      }
      break;
    }

    case ValueType::Array: {
      ArrayIterator it(slice);
      _sink->push_back('[');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          indent();
          dumpValue(it.value(), &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      }
      _sink->push_back(']');
      break;
    }

    case ValueType::Object: {
      ObjectIterator it(slice, !options->dumpAttributesInIndexOrder);
      _sink->push_back('{');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          auto current = (*it);
          indent();
          dumpValue(current.key, &slice);
          _sink->append(" : ", 3);
          dumpValue(current.value, &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          _sink->push_back(' ');
          dumpValue(current.value, &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          dumpValue(current.value, &slice);
          it.next();
        }
      }
      _sink->push_back('}');
      break;
    }

    case ValueType::Double: {
      double const v = slice.getDouble();

      if (!std::isnan(v) && !std::isinf(v)) {
        appendDouble(v);
        break;
      }

      if (options->unsupportedDoublesAsString) {
        if (std::isnan(v)) {
          _sink->append("\"NaN\"", 5);
          break;
        } else if (std::isinf(v)) {
          _sink->push_back('"');
          if (v == -INFINITY) {
            _sink->push_back('-');
          }
          _sink->append("Infinity\"", 9);
          break;
        }
      }

      handleUnsupportedType(slice);
      break;
    }

    case ValueType::Int:
    case ValueType::UInt:
    case ValueType::SmallInt: {
      dumpInteger(slice);
      break;
    }

    case ValueType::String: {
      ValueLength len;
      char const* p = slice.getString(len);
      _sink->reserve(2 + len);
      _sink->push_back('"');
      dumpString(p, len);
      _sink->push_back('"');
      break;
    }

    case ValueType::External: {
      if (base == nullptr) {
        base = &slice;
      }

      Slice external(reinterpret_cast<uint8_t const*>(slice.getExternal()));
      dumpValue(external, base);
      break;
    }

    case ValueType::Tagged: {
      dump(slice.value());
      break;
    }

    case ValueType::Binary: {
      if (options->binaryAsHex) {
        _sink->push_back('"');
        ValueLength len;
        uint8_t const* bin = slice.getBinary(len);
        for (ValueLength i = 0; i < len; ++i) {
          uint8_t value = bin[i];
          uint8_t x = value / 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
          x = value % 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
        }
        _sink->push_back('"');
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::UTCDate: {
      if (options->datesAsIntegers) {
        appendInt(slice.getUTCDate());
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::None:
    case ValueType::Illegal:
    case ValueType::MinKey:
    case ValueType::MaxKey: {
      handleUnsupportedType(slice);
      break;
    }

    case ValueType::BCD: {
      // TODO
      throw Exception(Exception::NotImplemented);
    }

    case ValueType::Custom: {
      if (options->customTypeHandler == nullptr) {
        throw Exception(Exception::NeedCustomTypeHandler);
      }
      if (base == nullptr) {
        base = &slice;
      }
      options->customTypeHandler->dump(slice, this, *base);
      break;
    }
  }
}